

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regiongraph.cpp
# Opt level: O1

void __thiscall libDAI::RegionGraph::RecomputeORs(RegionGraph *this,VarSet *ns)

{
  ulong *puVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  ulong uVar9;
  bool bVar10;
  _Rb_tree_node_base *p_Var11;
  long lVar12;
  ulong uVar13;
  pointer pFVar14;
  _Self __tmp;
  ulong uVar15;
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  
  pFVar14 = (this->_rg)._V1.super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->_rg)._V1.super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>._M_impl.
      super__Vector_impl_data._M_finish != pFVar14) {
    uVar15 = 0;
    do {
      bVar10 = VarSet::operator&&((VarSet *)(pFVar14 + uVar15),ns);
      auVar16 = vbroadcastsd_avx512f(ZEXT816(0x3ff0000000000000));
      auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      if (bVar10) {
        pFVar14 = (this->_rg)._V1.
                  super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar2 = *(long *)&pFVar14[uVar15].super_Factor._p._p;
        lVar12 = (long)*(pointer *)((long)&pFVar14[uVar15].super_Factor._p + 8) - lVar2;
        if (lVar12 != 0) {
          lVar12 = lVar12 >> 3;
          auVar18 = vpbroadcastq_avx512f();
          uVar13 = 0;
          do {
            auVar19 = vpbroadcastq_avx512f();
            auVar19 = vporq_avx512f(auVar19,auVar17);
            uVar9 = vpcmpuq_avx512f(auVar19,auVar18,2);
            puVar1 = (ulong *)(lVar2 + uVar13 * 8);
            bVar10 = (bool)((byte)uVar9 & 1);
            bVar3 = (bool)((byte)(uVar9 >> 1) & 1);
            bVar4 = (bool)((byte)(uVar9 >> 2) & 1);
            bVar5 = (bool)((byte)(uVar9 >> 3) & 1);
            bVar6 = (bool)((byte)(uVar9 >> 4) & 1);
            bVar7 = (bool)((byte)(uVar9 >> 5) & 1);
            bVar8 = (bool)((byte)(uVar9 >> 6) & 1);
            *puVar1 = (ulong)bVar10 * auVar16._0_8_ | (ulong)!bVar10 * *puVar1;
            puVar1[1] = (ulong)bVar3 * auVar16._8_8_ | (ulong)!bVar3 * puVar1[1];
            puVar1[2] = (ulong)bVar4 * auVar16._16_8_ | (ulong)!bVar4 * puVar1[2];
            puVar1[3] = (ulong)bVar5 * auVar16._24_8_ | (ulong)!bVar5 * puVar1[3];
            puVar1[4] = (ulong)bVar6 * auVar16._32_8_ | (ulong)!bVar6 * puVar1[4];
            puVar1[5] = (ulong)bVar7 * auVar16._40_8_ | (ulong)!bVar7 * puVar1[5];
            puVar1[6] = (ulong)bVar8 * auVar16._48_8_ | (ulong)!bVar8 * puVar1[6];
            puVar1[7] = (uVar9 >> 7) * auVar16._56_8_ | (ulong)!SUB81(uVar9 >> 7,0) * puVar1[7];
            uVar13 = uVar13 + 8;
          } while ((lVar12 + (ulong)(lVar12 == 0) + 7 & 0xfffffffffffffff8) != uVar13);
        }
      }
      uVar15 = uVar15 + 1;
      pFVar14 = (this->_rg)._V1.
                super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar15 < (ulong)((long)(this->_rg)._V1.
                                    super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar14 >> 6)
            );
  }
  for (p_Var11 = (this->_fac2OR)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var11 != &(this->_fac2OR)._M_t._M_impl.super__Rb_tree_header;
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
    bVar10 = VarSet::operator&&((VarSet *)
                                ((this->_rg)._V1.
                                 super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>
                                 ._M_impl.super__Vector_impl_data._M_start +
                                (long)p_Var11[1]._M_parent),ns);
    if (bVar10) {
      TFactor<double>::operator*=
                (&(this->_rg)._V1.
                  super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)p_Var11[1]._M_parent].super_Factor,
                 (this->_fg)._fg._V2.
                 super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + *(long *)(p_Var11 + 1));
    }
  }
  return;
}

Assistant:

void RegionGraph::RecomputeORs( const VarSet &ns ) {
        for( size_t alpha = 0; alpha < nr_ORs(); alpha++ )
            if( OR(alpha).vars() && ns )
                OR(alpha).fill( 1.0 );
        for( fac2OR_cit I = _fac2OR.begin(); I != _fac2OR.end(); I++ )
            if( OR( I->second ).vars() && ns )
                OR( I->second ) *= _fg.factor( I->first );
    }